

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Module.c
# Opt level: O1

int init(EVP_PKEY_CTX *ctx)

{
  MCRegisterInfo *MRI;
  
  MRI = (MCRegisterInfo *)(*cs_mem_malloc)(0x58);
  XCore_init(MRI);
  *(code **)(ctx + 8) = XCore_printInst;
  *(MCRegisterInfo **)(ctx + 0x10) = MRI;
  *(MCRegisterInfo **)(ctx + 0x20) = MRI;
  *(code **)(ctx + 0x18) = XCore_getInstruction;
  *(code **)(ctx + 0x50) = XCore_post_printer;
  *(code **)(ctx + 0x30) = XCore_reg_name;
  *(code **)(ctx + 0x48) = XCore_get_insn_id;
  *(code **)(ctx + 0x38) = XCore_insn_name;
  *(code **)(ctx + 0x40) = XCore_group_name;
  return 0;
}

Assistant:

static cs_err init(cs_struct *ud)
{
	MCRegisterInfo *mri;

	// verify if requested mode is valid
	if (ud->mode & ~(CS_MODE_LITTLE_ENDIAN | CS_MODE_32 | CS_MODE_64 | CS_MODE_16))
		return CS_ERR_MODE;

	mri = cs_mem_malloc(sizeof(*mri));

	X86_init(mri);

	// by default, we use Intel syntax
	ud->printer = X86_Intel_printInst;
	ud->syntax = CS_OPT_SYNTAX_INTEL;
	ud->printer_info = mri;
	ud->disasm = X86_getInstruction;
	ud->reg_name = X86_reg_name;
	ud->insn_id = X86_get_insn_id;
	ud->insn_name = X86_insn_name;
	ud->group_name = X86_group_name;
	ud->post_printer = NULL;;

	if (ud->mode == CS_MODE_64)
		ud->regsize_map = regsize_map_64;
	else
		ud->regsize_map = regsize_map_32;

	return CS_ERR_OK;
}